

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcode.c
# Opt level: O0

int sizei(Instruction *i)

{
  uint uVar1;
  Instruction *i_local;
  
  uVar1 = (uint)(i->i).code;
  if (uVar1 == 2) {
LAB_00136187:
    i_local._4_4_ = 9;
  }
  else {
    if (1 < uVar1 - 3) {
      if (uVar1 == 5) {
        return 10;
      }
      if (uVar1 == 6) goto LAB_00136187;
      if (6 < uVar1 - 10) {
        return 1;
      }
    }
    i_local._4_4_ = 2;
  }
  return i_local._4_4_;
}

Assistant:

int sizei (const Instruction *i) {
  switch((Opcode)i->i.code) {
    case ISet: case ISpan: return CHARSETINSTSIZE;
    case ITestSet: return CHARSETINSTSIZE + 1;
    case ITestChar: case ITestAny: case IChoice: case IJmp: case ICall:
    case IOpenCall: case ICommit: case IPartialCommit: case IBackCommit:
      return 2;
    default: return 1;
  }
}